

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::processRoot
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  int iVar2;
  TABLE *pTVar3;
  TAG *pTVar4;
  ostream *poVar5;
  Session *pSVar6;
  _Base_ptr p_Var7;
  char *pcVar8;
  ostream *stream;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> sessions;
  string href;
  string local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  HR hr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  EM em;
  CAPTION caption;
  TABLE table;
  
  stream = (ostream *)(b + 0x10);
  HTML::TABLE::TABLE(&table,stream);
  pTVar3 = HTML::TABLE::border(&table,1);
  pTVar3 = HTML::TABLE::cellspacing(pTVar3,2);
  pTVar4 = &HTML::TABLE::width(pTVar3,100)->super_TAG;
  HTML::TAG::text(pTVar4);
  HTML::CAPTION::CAPTION(&caption,stream);
  HTML::TAG::text(&caption.super_TAG);
  HTML::EM::EM(&em,stream);
  HTML::TAG::text(&em.super_TAG);
  Session::numSessions();
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  std::operator<<(poVar5," Sessions managed by QuickFIX");
  HTML::HR::HR(&hr,stream);
  HTML::TAG::text(&hr.super_TAG);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/resetSessions",&href);
  pTVar4 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"RESET",(allocator<char> *)&local_750);
  HTML::TAG::text(pTVar4,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/refreshSessions",&href);
  pTVar4 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"REFRESH",(allocator<char> *)&local_750);
  HTML::TAG::text(pTVar4,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/enableSessions",&href);
  pTVar4 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"ENABLE",(allocator<char> *)&local_750);
  HTML::TAG::text(pTVar4,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  std::operator<<(stream,HTML::NBSP);
  HTML::A::A((A *)&hr,stream);
  HttpMessage::getParameterString_abi_cxx11_(&href,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sessions,
                 "/disableSessions",&href);
  pTVar4 = &HTML::A::href((A *)&hr,(string *)&sessions)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"DISABLE",(allocator<char> *)&local_750);
  HTML::TAG::text(pTVar4,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&href);
  HTML::TAG::~TAG(&hr.super_TAG);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TAG::~TAG(&caption.super_TAG);
  HTML::TR::TR((TR *)&caption,stream);
  HTML::TAG::text(&caption.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&href);
  pTVar4 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessions,"Session",(allocator<char> *)&local_770);
  HTML::TAG::text(pTVar4,(string *)&sessions);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&href);
  pTVar4 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessions,"ConnectionType",(allocator<char> *)&local_770);
  HTML::TAG::text(pTVar4,(string *)&sessions);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&href);
  pTVar4 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessions,"Enabled",(allocator<char> *)&local_770);
  HTML::TAG::text(pTVar4,(string *)&sessions);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&href);
  pTVar4 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessions,"Session Time",(allocator<char> *)&local_770);
  HTML::TAG::text(pTVar4,(string *)&sessions);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&href);
  pTVar4 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessions,"Logged On",(allocator<char> *)&local_770);
  HTML::TAG::text(pTVar4,(string *)&sessions);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&href);
  pTVar4 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessions,"Next Incoming",(allocator<char> *)&local_770);
  HTML::TAG::text(pTVar4,(string *)&sessions);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TD::TD((TD *)&em,stream);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&hr,"center",(allocator<char> *)&href);
  pTVar4 = &HTML::TD::align((TD *)&em,(string *)&hr)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sessions,"Next Outgoing",(allocator<char> *)&local_770);
  HTML::TAG::text(pTVar4,(string *)&sessions);
  std::__cxx11::string::~string((string *)&sessions);
  std::__cxx11::string::~string((string *)&hr);
  HTML::TAG::~TAG(&em.super_TAG);
  HTML::TAG::~TAG(&caption.super_TAG);
  Session::getSessions();
  for (p_Var7 = sessions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &sessions._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    pSVar6 = Session::lookupSession((SessionID *)(p_Var7 + 1));
    if (pSVar6 != (Session *)0x0) {
      HTML::TR::TR((TR *)&caption.super_TAG,stream);
      HTML::TAG::text(&caption.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      HTML::TAG::text(&em.super_TAG);
      std::operator+(&local_578,"/session?BeginString=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var7[1]._M_left);
      std::operator+(&local_750,&local_578,"&SenderCompID=");
      std::operator+(&local_770,&local_750,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var7[4]._M_left);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &hr.super_TAG,&local_770,"&TargetCompID=");
      std::operator+(&href,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &hr.super_TAG,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var7[7]._M_left);
      std::__cxx11::string::~string((string *)&hr.super_TAG);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_578);
      if (p_Var7[10]._M_parent != (_Base_ptr)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &hr.super_TAG,"&SessionQualifier=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 10));
        std::__cxx11::string::append((string *)&href);
        std::__cxx11::string::~string((string *)&hr.super_TAG);
      }
      HTML::A::A((A *)&hr.super_TAG,stream);
      pTVar4 = &HTML::A::href((A *)&hr.super_TAG,&href)->super_TAG;
      std::__cxx11::string::string((string *)&local_770,(string *)&p_Var7[0xb]._M_parent);
      HTML::TAG::text(pTVar4,&local_770);
      std::__cxx11::string::~string((string *)&local_770);
      HTML::TAG::~TAG(&hr.super_TAG);
      std::__cxx11::string::~string((string *)&href);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      pcVar8 = "No sessions defined for acceptor";
      if ((pSVar6->m_state).m_initiate != false) {
        pcVar8 = "No sessions defined for initiator";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hr.super_TAG,pcVar8 + 0x18,(allocator<char> *)&href);
      HTML::TAG::text(&em.super_TAG,(string *)&hr.super_TAG);
      std::__cxx11::string::~string((string *)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      pcVar8 = "no";
      if ((pSVar6->m_state).m_enabled != false) {
        pcVar8 = "yes";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hr.super_TAG,pcVar8,(allocator<char> *)&href);
      HTML::TAG::text(&em.super_TAG,(string *)&hr.super_TAG);
      std::__cxx11::string::~string((string *)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&href);
      bVar1 = TimeRange::isInRange(&pSVar6->m_sessionTime,(UtcTimeStamp *)&href);
      pcVar8 = "no";
      if (bVar1) {
        pcVar8 = "yes";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hr.super_TAG,pcVar8,(allocator<char> *)&local_770);
      HTML::TAG::text(&em.super_TAG,(string *)&hr.super_TAG);
      std::__cxx11::string::~string((string *)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      pcVar8 = "no";
      if (((pSVar6->m_state).m_receivedLogon & (pSVar6->m_state).m_sentLogon) != 0) {
        pcVar8 = "yes";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hr.super_TAG,pcVar8,(allocator<char> *)&href);
      HTML::TAG::text(&em.super_TAG,(string *)&hr.super_TAG);
      std::__cxx11::string::~string((string *)&hr.super_TAG);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      iVar2 = SessionState::getNextTargetMsgSeqNum(&pSVar6->m_state);
      HTML::TAG::text(&em.super_TAG,iVar2);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TD::TD((TD *)&em.super_TAG,stream);
      iVar2 = SessionState::getNextSenderMsgSeqNum(&pSVar6->m_state);
      HTML::TAG::text(&em.super_TAG,iVar2);
      HTML::TAG::~TAG(&em.super_TAG);
      HTML::TAG::~TAG(&caption.super_TAG);
    }
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&sessions._M_t);
  HTML::TAG::~TAG(&table.super_TAG);
  return;
}

Assistant:

void HttpConnection::processRoot
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  TABLE table(b); table.border(1).cellspacing(2).width(100).text();

  { CAPTION caption(b); caption.text();
    EM em(b); em.text();
    b << Session::numSessions() << " Sessions managed by QuickFIX";
    { HR hr(b); hr.text(); }
    { b << NBSP; A a(b); a.href("/resetSessions" + request.getParameterString()).text("RESET"); }
    { b << NBSP; A a(b); a.href("/refreshSessions" + request.getParameterString()).text("REFRESH"); }
    { b << NBSP; A a(b); a.href("/enableSessions" + request.getParameterString()).text("ENABLE"); }
    { b << NBSP; A a(b); a.href("/disableSessions" + request.getParameterString()).text("DISABLE"); }
  }

  { TR tr(b); tr.text();
    { TD td(b); td.align("center").text("Session"); }
    { TD td(b); td.align("center").text("ConnectionType"); }
    { TD td(b); td.align("center").text("Enabled"); }
    { TD td(b); td.align("center").text("Session Time"); }
    { TD td(b); td.align("center").text("Logged On"); }
    { TD td(b); td.align("center").text("Next Incoming"); }
    { TD td(b); td.align("center").text("Next Outgoing"); }
  }

  std::set<SessionID> sessions = Session::getSessions();
  std::set<SessionID>::iterator i;
  for( i = sessions.begin(); i != sessions.end(); ++i )
  {
    Session* pSession = Session::lookupSession( *i );
    if( !pSession ) continue;

    { TR tr(b); tr.text();
      { TD td(b); td.text();
        std::string href = "/session?BeginString=" + i->getBeginString().getValue() +
                            "&SenderCompID=" + i->getSenderCompID().getValue() +
                            "&TargetCompID=" + i->getTargetCompID().getValue();
        if( i->getSessionQualifier().size() )
          href += "&SessionQualifier=" + i->getSessionQualifier();

        A a(b); a.href(href).text(i->toString());
      }
      { TD td(b); td.text(pSession->isInitiator() ? "initiator" : "acceptor"); }
      { TD td(b); td.text(pSession->isEnabled() ? "yes" : "no"); }
      { TD td(b); td.text(pSession->isSessionTime(UtcTimeStamp()) ? "yes" : "no"); }
      { TD td(b); td.text(pSession->isLoggedOn() ? "yes" : "no"); }
      { TD td(b); td.text(pSession->getExpectedTargetNum()); }
      { TD td(b); td.text(pSession->getExpectedSenderNum()); }
    }
  }
}